

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

char32_t dpfb::unicode::strToCp(char *str,char **end)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char32_t cVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  byte bVar9;
  char *pcVar10;
  
  pcVar6 = str + 1;
  do {
    pcVar10 = pcVar6;
    cVar1 = pcVar10[-1];
    iVar4 = isspace((int)cVar1);
    pcVar6 = pcVar10 + 1;
  } while (iVar4 != 0);
  pcVar6 = pcVar10 + -1;
  cVar5 = L'\0';
  uVar7 = 10;
  if ((cVar1 == 'U') && (*pcVar10 == '+')) {
    uVar7 = 0x10;
    bVar2 = true;
    pcVar6 = pcVar10 + 1;
  }
  else {
    bVar2 = false;
  }
  bVar8 = false;
  do {
    cVar1 = *pcVar6;
    bVar9 = cVar1 - 0x30;
    if (bVar9 < 10) {
LAB_0011d541:
      pcVar6 = pcVar6 + 1;
      if ((0xffffffff / uVar7 < (uint)cVar5 || cVar5 == L'\xffffffff') ||
         ((cVar5 == 0xffffffff / uVar7 && (0xffffffffU % uVar7 < (uint)bVar9)))) {
        cVar5 = L'\xffffffff';
      }
      else {
        cVar5 = cVar5 * uVar7 + (uint)bVar9;
      }
      bVar8 = true;
      bVar3 = true;
    }
    else {
      if (bVar2) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar9 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) goto LAB_0011d570;
          bVar9 = cVar1 - 0x37;
        }
        goto LAB_0011d541;
      }
LAB_0011d570:
      bVar3 = false;
    }
    if (!bVar3) {
      if (end != (char **)0x0) {
        if (bVar8) {
          str = pcVar6;
        }
        *end = str;
      }
      return cVar5;
    }
  } while( true );
}

Assistant:

char32_t strToCp(const char* str, const char** end)
{
    // It's easier to roll our own routine than to use strtol(),
    // because otherwise we need:
    //    1. Ensure there is no leading -.
    //    2. Take into account that strtol() accepts optional "0x"
    //       or "0X" prefixes for base 16, which we should treat
    //       as 0.

    char32_t result = 0;

    const char* strStart = str;

    while (std::isspace(*str))
        ++str;

    int base;
    if (*str == 'U' && str[1] == '+') {
        base = 16;
        str += 2;
    } else
        base = 10;

    const auto max = UINT_LEAST32_MAX;
    const auto cutoff = max / base;
    const auto cutlimit = max % base;

    bool wasDigits = false;
    while (true) {
        unsigned char c = *str;

        if (c >= '0' && c <= '9')
            c -= '0';
        else if (base == 16) {
            if (c >= 'a' && c <= 'f')
                c -= 'a' - 10;
            else if (c >= 'A' && c <= 'F')
                c -= 'A' - 10;
            else
                break;
        } else
            break;

        wasDigits = true;
        ++str;

        if (result == max
                || result > cutoff
                || (result == cutoff && c > cutlimit))
            result = max;
        else {
            result *= base;
            result += c;
        }
    }

    if (end) {
        if (wasDigits)
            *end = str;
        else
            *end = strStart;
    }

    return result;
}